

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_get_cursor_in_seconds(ma_data_source *pDataSource,float *pCursor)

{
  ma_result mVar1;
  long lVar2;
  uint uVar3;
  ma_data_source_base *pDataSourceBase;
  float fVar4;
  float fVar5;
  ma_format format;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ulong local_30;
  uint local_28;
  undefined1 local_24 [4];
  
  if (pCursor != (float *)0x0) {
    *pCursor = 0.0;
    fVar5 = 0.0;
    if (pDataSource == (ma_data_source *)0x0) {
      mVar1 = MA_SUCCESS;
    }
    else if (*(code **)(*pDataSource + 0x18) == (code *)0x0) {
      mVar1 = MA_NOT_IMPLEMENTED;
    }
    else {
      mVar1 = (**(code **)(*pDataSource + 0x18))(pDataSource,&local_30);
      fVar5 = 0.0;
      if (mVar1 == MA_SUCCESS) {
        mVar1 = MA_SUCCESS;
        lVar2 = 0;
        if (*(ulong *)((long)pDataSource + 8) <= local_30) {
          lVar2 = local_30 - *(ulong *)((long)pDataSource + 8);
        }
        fVar5 = (float)lVar2;
      }
    }
    if (mVar1 == MA_SUCCESS) {
      fVar4 = 0.0;
      if (pDataSource == (ma_data_source *)0x0) {
        mVar1 = MA_INVALID_ARGS;
      }
      else if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
        mVar1 = MA_NOT_IMPLEMENTED;
      }
      else {
        mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,&local_30,local_24,&local_28,0,0);
        uVar3 = 0;
        if (mVar1 == MA_SUCCESS) {
          uVar3 = local_28;
        }
        fVar4 = (float)uVar3;
      }
      if (mVar1 == MA_SUCCESS) {
        *pCursor = fVar5 / fVar4;
        mVar1 = MA_SUCCESS;
      }
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_seconds(ma_data_source* pDataSource, float* pCursor)
{
    ma_result result;
    ma_uint64 cursorInPCMFrames;
    ma_uint32 sampleRate;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &cursorInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pCursor = (ma_int64)cursorInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}